

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall libtorrent::session::abort(session *this)

{
  element_type *this_00;
  alert_manager *this_01;
  long in_RSI;
  shared_ptr<libtorrent::aux::session_impl> local_78;
  shared_ptr<std::thread> local_68;
  shared_ptr<boost::asio::io_context> local_58 [2];
  function<void_()> local_38;
  session *this_local;
  
  this_local = this;
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(in_RSI + 0x30));
  this_01 = libtorrent::aux::session_impl::alerts(this_00);
  ::std::function<void_()>::function(&local_38);
  libtorrent::aux::alert_manager::set_notify_function(this_01,&local_38);
  ::std::function<void_()>::~function(&local_38);
  ::std::shared_ptr<boost::asio::io_context>::shared_ptr
            (local_58,(shared_ptr<boost::asio::io_context> *)(in_RSI + 0x10));
  ::std::shared_ptr<std::thread>::shared_ptr(&local_68,(shared_ptr<std::thread> *)(in_RSI + 0x20));
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            (&local_78,(shared_ptr<libtorrent::aux::session_impl> *)(in_RSI + 0x30));
  session_proxy::session_proxy((session_proxy *)this,local_58,&local_68,&local_78);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr(&local_78);
  ::std::shared_ptr<std::thread>::~shared_ptr(&local_68);
  ::std::shared_ptr<boost::asio::io_context>::~shared_ptr(local_58);
  return;
}

Assistant:

session_proxy session::abort()
	{
		// stop calling the alert notify function now, to avoid it thinking the
		// session is still alive
		m_impl->alerts().set_notify_function({});
		return session_proxy(m_io_service, m_thread, m_impl);
	}